

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O2

void __thiscall
icu_63::Decomposer::rangeHandler(Decomposer *this,UChar32 start,UChar32 end,Norm *norm)

{
  short sVar1;
  UnicodeString *pUVar2;
  Norms *this_00;
  UnicodeString *this_01;
  byte bVar3;
  byte bVar4;
  UChar32 c;
  int32_t iVar5;
  uint c_00;
  long lVar6;
  Norm *pNVar7;
  UnicodeString *this_02;
  UChar *buffer_00;
  ulong uVar8;
  size_t size;
  char *__format;
  int32_t iVar9;
  int srcLength;
  int offset;
  uint c_01;
  ConstChar16Ptr local_68;
  UChar32 local_5c;
  char16_t *local_58;
  UChar buffer [3];
  
  if ((int)norm->mappingType < 2) {
    return;
  }
  pUVar2 = norm->mapping;
  local_5c = end;
  local_58 = UnicodeString::getBuffer(pUVar2);
  sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (pUVar2->fUnion).fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  offset = 0;
  do {
    this_02 = (UnicodeString *)0x0;
    srcLength = offset;
LAB_001ea8d1:
    while( true ) {
      while( true ) {
        if (iVar9 <= srcLength) {
          if (this_02 == (UnicodeString *)0x0) {
            return;
          }
          pUVar2 = norm->mapping;
          if (norm->rawMapping == (UnicodeString *)0x0) {
            norm->rawMapping = pUVar2;
          }
          else if (pUVar2 != (UnicodeString *)0x0) {
            (*(pUVar2->super_Replaceable).super_UObject._vptr_UObject[1])();
          }
          norm->mapping = this_02;
          this->didDecompose = this->didDecompose | 1;
          return;
        }
        offset = srcLength + 1;
        c_01 = (uint)(ushort)local_58[srcLength];
        if ((((c_01 & 0xfc00) == 0xd800) && (offset != iVar9)) &&
           (lVar6 = (long)offset, ((ushort)local_58[lVar6] & 0xfc00) == 0xdc00)) {
          offset = srcLength + 2;
          c_01 = (uint)(ushort)local_58[srcLength] * 0x400 + (uint)(ushort)local_58[lVar6] +
                 0xfca02400;
        }
        if ((int)c_01 <= local_5c && start <= (int)c_01) {
          fprintf(_stderr,"gennorm2 error: U+%04lX maps to itself directly or indirectly\n",
                  (ulong)c_01);
          goto LAB_001eab13;
        }
        size = (size_t)c_01;
        pNVar7 = Norms::getNormRef((this->super_Enumerator).norms,c_01);
        if ((int)pNVar7->mappingType < 2) break;
        if (norm->mappingType == ROUND_TRIP) {
          if (srcLength != 0) goto LAB_001eab1b;
          if (pNVar7->mappingType != ROUND_TRIP) {
            __format = 
            "gennorm2 error: U+%04lX\'s round-trip mapping\'s starter U+%04lX one-way-decomposes, not possible in Unicode normalization\n"
            ;
            goto LAB_001eab4f;
          }
          this_00 = (this->super_Enumerator).norms;
          c = UnicodeString::char32At(pUVar2,offset);
          bVar3 = Norms::getCC(this_00,c);
          this_01 = pNVar7->mapping;
          sVar1 = (this_01->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (this_01->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          c_00 = UnicodeString::char32At(this_01,iVar5 + -1);
          uVar8 = (ulong)c_00;
          bVar4 = Norms::getCC((this->super_Enumerator).norms,c_00);
          size = CONCAT71((int7)(uVar8 >> 8),bVar3);
          if (bVar3 < bVar4) {
            fprintf(_stderr,
                    "gennorm2 error: U+%04lX\'s round-trip mapping\'s starter U+%04lX decomposes and the inner/earlier tccc=%hu > outer/following tccc=%hu, not possible in Unicode normalization\n"
                    ,(long)start,(ulong)c_01,(ulong)bVar4,(ulong)bVar3);
            goto LAB_001eab13;
          }
        }
        if (this_02 == (UnicodeString *)0x0) {
          this_02 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,size);
          UnicodeString::UnicodeString(this_02,pUVar2,0,srcLength);
        }
        UnicodeString::append(this_02,pNVar7->mapping);
        srcLength = offset;
      }
      if (c_01 - 0xd7a4 < 0xffffd45c) break;
      buffer_00 = buffer;
      iVar5 = Hangul::decompose(c_01,buffer_00);
      if ((srcLength != 0) && (norm->mappingType == ROUND_TRIP)) {
LAB_001eab1b:
        __format = 
        "gennorm2 error: U+%04lX\'s round-trip mapping\'s non-starter U+%04lX decomposes, not possible in Unicode normalization\n"
        ;
LAB_001eab4f:
        fprintf(_stderr,__format,(long)start,(ulong)c_01);
LAB_001eab13:
        exit(3);
      }
      if (this_02 == (UnicodeString *)0x0) {
        this_02 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)buffer_00);
        UnicodeString::UnicodeString(this_02,pUVar2,0,srcLength);
      }
      local_68.p_ = buffer;
      UnicodeString::append(this_02,&local_68,iVar5);
      srcLength = offset;
    }
  } while (this_02 == (UnicodeString *)0x0);
  UnicodeString::doAppend(this_02,pUVar2,srcLength,offset - srcLength);
  srcLength = offset;
  goto LAB_001ea8d1;
}

Assistant:

void Decomposer::rangeHandler(UChar32 start, UChar32 end, Norm &norm) {
    if(!norm.hasMapping()) { return; }
    const UnicodeString &m=*norm.mapping;
    UnicodeString *decomposed=nullptr;
    const UChar *s=toUCharPtr(m.getBuffer());
    int32_t length=m.length();
    int32_t prev, i=0;
    UChar32 c;
    while(i<length) {
        prev=i;
        U16_NEXT(s, i, length, c);
        if(start<=c && c<=end) {
            fprintf(stderr,
                    "gennorm2 error: U+%04lX maps to itself directly or indirectly\n",
                    (long)c);
            exit(U_INVALID_FORMAT_ERROR);
        }
        const Norm &cNorm=norms.getNormRef(c);
        if(cNorm.hasMapping()) {
            if(norm.mappingType==Norm::ROUND_TRIP) {
                if(prev==0) {
                    if(cNorm.mappingType!=Norm::ROUND_TRIP) {
                        fprintf(stderr,
                                "gennorm2 error: "
                                "U+%04lX's round-trip mapping's starter "
                                "U+%04lX one-way-decomposes, "
                                "not possible in Unicode normalization\n",
                                (long)start, (long)c);
                        exit(U_INVALID_FORMAT_ERROR);
                    }
                    uint8_t myTrailCC=norms.getCC(m.char32At(i));
                    UChar32 cTrailChar=cNorm.mapping->char32At(cNorm.mapping->length()-1);
                    uint8_t cTrailCC=norms.getCC(cTrailChar);
                    if(cTrailCC>myTrailCC) {
                        fprintf(stderr,
                                "gennorm2 error: "
                                "U+%04lX's round-trip mapping's starter "
                                "U+%04lX decomposes and the "
                                "inner/earlier tccc=%hu > outer/following tccc=%hu, "
                                "not possible in Unicode normalization\n",
                                (long)start, (long)c,
                                (short)cTrailCC, (short)myTrailCC);
                        exit(U_INVALID_FORMAT_ERROR);
                    }
                } else {
                    fprintf(stderr,
                            "gennorm2 error: "
                            "U+%04lX's round-trip mapping's non-starter "
                            "U+%04lX decomposes, "
                            "not possible in Unicode normalization\n",
                            (long)start, (long)c);
                    exit(U_INVALID_FORMAT_ERROR);
                }
            }
            if(decomposed==nullptr) {
                decomposed=new UnicodeString(m, 0, prev);
            }
            decomposed->append(*cNorm.mapping);
        } else if(Hangul::isHangul(c)) {
            UChar buffer[3];
            int32_t hangulLength=Hangul::decompose(c, buffer);
            if(norm.mappingType==Norm::ROUND_TRIP && prev!=0) {
                fprintf(stderr,
                        "gennorm2 error: "
                        "U+%04lX's round-trip mapping's non-starter "
                        "U+%04lX decomposes, "
                        "not possible in Unicode normalization\n",
                        (long)start, (long)c);
                exit(U_INVALID_FORMAT_ERROR);
            }
            if(decomposed==nullptr) {
                decomposed=new UnicodeString(m, 0, prev);
            }
            decomposed->append(buffer, hangulLength);
        } else if(decomposed!=nullptr) {
            decomposed->append(m, prev, i-prev);
        }
    }
    if(decomposed!=nullptr) {
        if(norm.rawMapping==nullptr) {
            // Remember the original mapping when decomposing recursively.
            norm.rawMapping=norm.mapping;
        } else {
            delete norm.mapping;
        }
        norm.mapping=decomposed;
        // Not  norm.setMappingCP();  because the original mapping
        // is most likely to be encodable as a delta.
        didDecompose|=TRUE;
    }
}